

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cluster::QueueOrWriteFrame(Cluster *this,Frame *frame)

{
  bool bVar1;
  Frame *pFVar2;
  mapped_type *pmVar3;
  _Self *p_Var4;
  reference ppFVar5;
  pointer ppVar6;
  reference ppFVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  reference __x;
  const_iterator local_b0;
  __normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
  local_a8;
  __normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
  local_a0;
  iterator iterator;
  iterator iStack_90;
  bool wrote_frame;
  _Self local_88;
  FrameMapIterator track_iterator;
  bool okay_to_write;
  Frame *frame_to_write;
  _Self local_68;
  iterator end;
  iterator current_track_iterator;
  vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
  frames_to_erase;
  Frame *local_30;
  Frame *frame_to_store;
  uint64_t track_number;
  Frame *frame_local;
  Cluster *this_local;
  
  if ((frame == (Frame *)0x0) ||
     (track_number = (uint64_t)frame, frame_local = (Frame *)this, bVar1 = Frame::IsValid(frame),
     !bVar1)) {
    this_local._7_1_ = 0;
  }
  else if ((this->write_last_frame_with_duration_ & 1U) == 0) {
    this_local._7_1_ = DoWriteFrame(this,(Frame *)track_number);
  }
  else {
    frame_to_store = (Frame *)Frame::track_number((Frame *)track_number);
    pFVar2 = (Frame *)operator_new(0x68);
    Frame::Frame(pFVar2);
    local_30 = pFVar2;
    Frame::CopyFrom(pFVar2,(Frame *)track_number);
    pmVar3 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](&this->stored_frames_,(key_type *)&frame_to_store);
    std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::push_back
              (pmVar3,&local_30);
    std::
    vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ::vector((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
              *)&current_track_iterator);
    pmVar3 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](&this->stored_frames_,(key_type *)&frame_to_store);
    end = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::begin(pmVar3);
    pmVar3 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](&this->stored_frames_,(key_type *)&frame_to_store);
    frame_to_write =
         (Frame *)std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::end
                            (pmVar3);
    p_Var4 = std::_List_iterator<mkvmuxer::Frame_*>::operator--
                       ((_List_iterator<mkvmuxer::Frame_*> *)&frame_to_write);
    local_68._M_node = p_Var4->_M_node;
    while (bVar1 = std::operator!=(&end,&local_68), bVar1) {
      ppFVar5 = std::_List_iterator<mkvmuxer::Frame_*>::operator*(&end);
      pFVar2 = *ppFVar5;
      track_iterator._M_node._7_1_ = 1;
      local_88._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
           ::begin(&this->stored_frames_);
      while( true ) {
        iStack_90 = std::
                    map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                    ::end(&this->stored_frames_);
        bVar1 = std::operator!=(&local_88,&stack0xffffffffffffff70);
        if (!bVar1) break;
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                 ::operator->(&local_88);
        if ((Frame *)ppVar6->first != frame_to_store) {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                   ::operator->(&local_88);
          ppFVar7 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::front
                              (&ppVar6->second);
          uVar8 = Frame::timestamp(*ppFVar7);
          uVar9 = Frame::timestamp(pFVar2);
          if (uVar8 < uVar9) {
            track_iterator._M_node._7_1_ = 0;
            break;
          }
        }
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
        ::operator++(&local_88);
      }
      if ((track_iterator._M_node._7_1_ & 1) == 0) break;
      iterator._M_current._7_1_ = DoWriteFrame(this,pFVar2);
      if (pFVar2 != (Frame *)0x0) {
        Frame::~Frame(pFVar2);
        operator_delete(pFVar2);
      }
      if ((iterator._M_current._7_1_ & 1) == 0) {
        this_local._7_1_ = 0;
        goto LAB_001420c0;
      }
      std::
      vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
      ::push_back((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                   *)&current_track_iterator,&end);
      std::_List_iterator<mkvmuxer::Frame_*>::operator++(&end);
    }
    local_a0._M_current =
         (_List_iterator<mkvmuxer::Frame_*> *)
         std::
         vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
         ::begin((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                  *)&current_track_iterator);
    while( true ) {
      local_a8._M_current =
           (_List_iterator<mkvmuxer::Frame_*> *)
           std::
           vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
           ::end((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                  *)&current_track_iterator);
      bVar1 = __gnu_cxx::operator!=(&local_a0,&local_a8);
      if (!bVar1) break;
      pmVar3 = std::
               map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
               ::operator[](&this->stored_frames_,(key_type *)&frame_to_store);
      __x = __gnu_cxx::
            __normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
            ::operator*(&local_a0);
      std::_List_const_iterator<mkvmuxer::Frame_*>::_List_const_iterator(&local_b0,__x);
      std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::erase
                (pmVar3,local_b0);
      __gnu_cxx::
      __normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
      ::operator++(&local_a0);
    }
    this_local._7_1_ = 1;
LAB_001420c0:
    iterator._M_current._0_4_ = 1;
    std::
    vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ::~vector((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
               *)&current_track_iterator);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Cluster::QueueOrWriteFrame(const Frame* const frame) {
  if (!frame || !frame->IsValid())
    return false;

  // If |write_last_frame_with_duration_| is not set, then write the frame right
  // away.
  if (!write_last_frame_with_duration_) {
    return DoWriteFrame(frame);
  }

  // Queue the current frame.
  uint64_t track_number = frame->track_number();
  Frame* const frame_to_store = new Frame();
  frame_to_store->CopyFrom(*frame);
  stored_frames_[track_number].push_back(frame_to_store);

  // Iterate through all queued frames in the current track except the last one
  // and write it if it is okay to do so (i.e.) no other track has an held back
  // frame with timestamp <= the timestamp of the frame in question.
  std::vector<std::list<Frame*>::iterator> frames_to_erase;
  for (std::list<Frame*>::iterator
           current_track_iterator = stored_frames_[track_number].begin(),
           end = --stored_frames_[track_number].end();
       current_track_iterator != end; ++current_track_iterator) {
    const Frame* const frame_to_write = *current_track_iterator;
    bool okay_to_write = true;
    for (FrameMapIterator track_iterator = stored_frames_.begin();
         track_iterator != stored_frames_.end(); ++track_iterator) {
      if (track_iterator->first == track_number) {
        continue;
      }
      if (track_iterator->second.front()->timestamp() <
          frame_to_write->timestamp()) {
        okay_to_write = false;
        break;
      }
    }
    if (okay_to_write) {
      const bool wrote_frame = DoWriteFrame(frame_to_write);
      delete frame_to_write;
      if (!wrote_frame)
        return false;
      frames_to_erase.push_back(current_track_iterator);
    } else {
      break;
    }
  }
  for (std::vector<std::list<Frame*>::iterator>::iterator iterator =
           frames_to_erase.begin();
       iterator != frames_to_erase.end(); ++iterator) {
    stored_frames_[track_number].erase(*iterator);
  }
  return true;
}